

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gba.h
# Opt level: O2

uint ClownLZSS::Internal::Gba::EncodeMatch(ClownLZSS_Match *match)

{
  uint __line;
  ulong uVar1;
  ulong uVar2;
  char *__assertion;
  
  uVar2 = match->length - 3;
  if (uVar2 < 0x10) {
    uVar1 = ~match->source + match->destination;
    if (uVar1 < 0x1000) {
      return (uint)(uVar1 >> 8) | (int)uVar2 << 4 | ((uint)uVar1 & 0xff) << 8;
    }
    __assertion = "IsInRange(offset, 0u, maximum_encoded_offset)";
    __line = 0x7a;
  }
  else {
    __assertion = "IsInRange(length, 0u, maximum_encoded_length)";
    __line = 0x79;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/Clownacy[P]clownlzss/compressors/gba.h"
                ,__line,
                "unsigned int ClownLZSS::Internal::Gba::EncodeMatch(const ClownLZSS_Match &)");
}

Assistant:

inline unsigned int EncodeMatch(const ClownLZSS_Match& match)
			{
				using namespace Compressor;

				const std::size_t length = match.length - minimum_match_length;
				const std::size_t offset = match.destination - match.source - 1;

				assert(IsInRange(length, 0u, maximum_encoded_length));
				assert(IsInRange(offset, 0u, maximum_encoded_offset));

				return ((offset & 255) << 8) | ((length) << 4) | (offset >> 8);
			}